

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_0::GenerateFBS
                   (string *__return_storage_ptr__,Parser *parser,string *file_name,bool no_log)

{
  size_t sVar1;
  bool bVar2;
  reference ppNVar3;
  size_type_conflict sVar4;
  reference this;
  ulong uVar5;
  pointer ppVar6;
  reference ppEVar7;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar8;
  reference ppEVar9;
  reference ppSVar10;
  reference ppFVar11;
  pointer pvVar12;
  undefined1 uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  reference local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *attribute;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
  local_550;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
  local_548;
  const_iterator it_4;
  value_type local_538;
  allocator<char> local_511;
  value_type local_510;
  undefined1 local_4f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attributes;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  FieldDef *local_438;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_428;
  iterator field_it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  int local_3dc;
  undefined1 local_3d8 [8];
  ProtobufToFbsIdMap proto_fbs_ids;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_388;
  const_iterator it_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  EnumVal *local_280;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_270;
  const_iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  EnumDef *local_1c8;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_1b8;
  const_iterator enum_def_it;
  Namespace *last_namespace;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  string basename;
  _Self local_e0;
  const_iterator it_1;
  int num_includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string schema;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  const_iterator local_50;
  ulong local_48;
  size_t i;
  Namespace *ns;
  __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_30;
  const_iterator it;
  bool no_log_local;
  string *file_name_local;
  Parser *parser_local;
  
  it._M_current._7_1_ = no_log;
  local_30._M_current =
       (Namespace **)
       std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::begin
                 (&parser->namespaces_);
  while( true ) {
    ns = (Namespace *)
         std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::end
                   (&parser->namespaces_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
                        *)&ns);
    if (!bVar2) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
              ::operator*(&local_30);
    i = (size_t)*ppNVar3;
    for (local_48 = 0; sVar1 = i, local_48 < *(ulong *)(i + 0x18); local_48 = local_48 + 1) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i);
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)sVar1,(sVar4 - 1) - local_48);
      std::__cxx11::string::operator+=((string *)this,"_");
    }
    if ((((parser->opts).proto_mode & 1U) != 0) &&
       (uVar5 = std::__cxx11::string::empty(), sVar1 = i, (uVar5 & 1) == 0)) {
      local_60._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i);
      local_58 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator-(&local_60,*(difference_type *)(i + 0x18));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_50,&local_58);
      schema.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)sVar1,local_50,&(parser->opts).proto_namespace_suffix);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
    ::operator++(&local_30);
  }
  std::__cxx11::string::string((string *)local_88);
  std::operator+(&local_c8,"// Generated from ",file_name);
  std::operator+(&local_a8,&local_c8,".proto\n\n");
  std::__cxx11::string::operator+=((string *)local_88,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (((parser->opts).include_dependence_headers & 1U) != 0) {
    it_1._M_node._0_4_ = 0;
    local_e0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(&parser->included_files_);
    while( true ) {
      basename.field_2._8_8_ =
           std::
           map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&parser->included_files_);
      bVar2 = std::operator!=(&local_e0,(_Self *)((long)&basename.field_2 + 8));
      if (!bVar2) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_e0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::string((string *)local_108);
        if (((parser->opts).keep_prefix & 1U) == 0) {
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_e0);
          StripExtension(&local_168,&ppVar6->second);
          StripPath(&local_148,&local_168);
          std::__cxx11::string::operator=((string *)local_108,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_168);
        }
        else {
          ppVar6 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator->(&local_e0);
          StripExtension(&local_128,&ppVar6->second);
          std::__cxx11::string::operator=((string *)local_108,(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &last_namespace,"include \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        std::operator+(&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &last_namespace,".fbs\";\n");
        std::__cxx11::string::operator+=((string *)local_88,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&last_namespace);
        it_1._M_node._0_4_ = (int)it_1._M_node + 1;
        std::__cxx11::string::~string((string *)local_108);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_e0);
    }
    if ((int)it_1._M_node != 0) {
      std::__cxx11::string::operator+=((string *)local_88,"\n");
    }
  }
  enum_def_it._M_current = (EnumDef **)0x0;
  local_1b8._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(parser->enums_).vec);
  while( true ) {
    enum_def = (EnumDef *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(parser->enums_).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_1b8,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&enum_def);
    if (!bVar2) break;
    ppEVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_1b8);
    local_1c8 = *ppEVar7;
    if ((((parser->opts).include_dependence_headers & 1U) == 0) ||
       (((local_1c8->super_Definition).generated & 1U) == 0)) {
      GenNameSpace((local_1c8->super_Definition).defined_namespace,(string *)local_88,
                   (Namespace **)&enum_def_it);
      uVar13 = 0x7c;
      GenComment(&(local_1c8->super_Definition).doc_comment,(string *)local_88,(CommentConfig *)0x0,
                 "");
      if ((local_1c8->is_union & 1U) == 0) {
        std::operator+(&local_228,"enum ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
        std::operator+(&local_208,&local_228," : ");
        std::__cxx11::string::operator+=((string *)local_88,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
      }
      else {
        std::operator+(&local_1e8,"union ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8);
        std::__cxx11::string::operator+=((string *)local_88,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      (anonymous_namespace)::GenType_abi_cxx11_
                ((string *)&it_2,(_anonymous_namespace_ *)&local_1c8->underlying_type,(Type *)0x1,
                 (bool)uVar13);
      std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                     " {\n");
      std::__cxx11::string::operator+=((string *)local_88,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&it_2);
      pvVar8 = EnumDef::Vals(local_1c8);
      local_270._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar8);
      while( true ) {
        pvVar8 = EnumDef::Vals(local_1c8);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar8);
        bVar2 = __gnu_cxx::operator!=
                          (&local_270,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar2) break;
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_270);
        local_280 = *ppEVar9;
        uVar13 = 0x1e;
        GenComment(&local_280->doc_comment,(string *)local_88,(CommentConfig *)0x0,"  ");
        if ((local_1c8->is_union & 1U) == 0) {
          std::operator+(&local_360,"  ",&local_280->name);
          std::operator+(&local_340,&local_360," = ");
          EnumDef::ToString_abi_cxx11_((string *)&it_3,local_1c8,local_280);
          std::operator+(&local_320,&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_3)
          ;
          std::operator+(&local_300,&local_320,",\n");
          std::__cxx11::string::operator+=((string *)local_88,(string *)&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&it_3);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
        }
        else {
          (anonymous_namespace)::GenType_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)&local_280->union_type,(Type *)0x0,
                     (bool)uVar13);
          std::operator+(&local_2c0,"  ",&local_2e0);
          std::operator+(&local_2a0,&local_2c0,",\n");
          std::__cxx11::string::operator+=((string *)local_88,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_270);
      }
      std::__cxx11::string::operator+=((string *)local_88,"}\n\n");
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_1b8);
  }
  local_388._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(parser->structs_).vec);
  while( true ) {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(&(parser->structs_).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_388,
                       (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar2) break;
    ppSVar10 = __gnu_cxx::
               __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
               ::operator*(&local_388);
    proto_fbs_ids._56_8_ = *ppSVar10;
    MapProtoIdsToFieldsId
              ((ProtobufToFbsIdMap *)local_3d8,(StructDef *)proto_fbs_ids._56_8_,
               (parser->opts).proto_id_gap_action,(bool)(it._M_current._7_1_ & 1));
    if (((byte)proto_fbs_ids.field_to_id._M_h._M_single_bucket & 1) == 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_3dc = 1;
    }
    else if ((((parser->opts).include_dependence_headers & 1U) == 0) ||
            ((*(byte *)(proto_fbs_ids._56_8_ + 0xa0) & 1) == 0)) {
      GenNameSpace(*(Namespace **)(proto_fbs_ids._56_8_ + 0xa8),(string *)local_88,
                   (Namespace **)&enum_def_it);
      GenComment((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(proto_fbs_ids._56_8_ + 0x40),(string *)local_88,(CommentConfig *)0x0,"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field_it,
                     "table ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              proto_fbs_ids._56_8_);
      std::operator+(&local_400,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field_it,
                     " {\n");
      std::__cxx11::string::operator+=((string *)local_88,(string *)&local_400);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&field_it);
      local_428._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      (proto_fbs_ids._56_8_ + 0xf8));
      while( true ) {
        field = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)(proto_fbs_ids._56_8_ + 0xf8));
        bVar2 = __gnu_cxx::operator!=
                          (&local_428,
                           (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&field);
        if (!bVar2) break;
        ppFVar11 = __gnu_cxx::
                   __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                   ::operator*(&local_428);
        local_438 = *ppFVar11;
        if ((local_438->value).type.base_type != BASE_TYPE_UTYPE) {
          uVar13 = 0x1e;
          GenComment(&(local_438->super_Definition).doc_comment,(string *)local_88,
                     (CommentConfig *)0x0,"  ");
          std::operator+(&local_498,"  ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_438);
          std::operator+(&local_478,&local_498,":");
          (anonymous_namespace)::GenType_abi_cxx11_
                    (&local_4b8,(_anonymous_namespace_ *)&local_438->value,(Type *)0x0,(bool)uVar13)
          ;
          std::operator+(&local_458,&local_478,&local_4b8);
          std::__cxx11::string::operator+=((string *)local_88,(string *)&local_458);
          std::__cxx11::string::~string((string *)&local_458);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_498);
          bVar2 = std::operator!=(&(local_438->value).constant,"0");
          if (bVar2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attributes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage," = ",
                           &(local_438->value).constant);
            std::__cxx11::string::operator+=
                      ((string *)local_88,
                       (string *)
                       &attributes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &attributes.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4f0);
          bVar2 = FieldDef::IsRequired(local_438);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_510,"required",&local_511);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f0,&local_510);
            std::__cxx11::string::~string((string *)&local_510);
            std::allocator<char>::~allocator(&local_511);
          }
          if ((local_438->key & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_538,"key",
                       (allocator<char> *)
                       ((long)&it_4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                               ._M_cur + 7));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4f0,&local_538);
            std::__cxx11::string::~string((string *)&local_538);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&it_4.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_true>
                               ._M_cur + 7));
          }
          if (((parser->opts).keep_proto_id & 1U) != 0) {
            local_548._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                 ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                         *)local_3d8,(key_type *)local_438);
            local_550._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                        *)local_3d8);
            bVar2 = std::__detail::operator!=(&local_548,&local_550);
            if (bVar2) {
              pvVar12 = std::__detail::
                        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_false,_true>
                                      *)&local_548);
              NumToString<unsigned_short>((string *)&__range6,pvVar12->second);
              std::operator+(&local_570,"id: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range6);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f0,&local_570);
              std::__cxx11::string::~string((string *)&local_570);
              std::__cxx11::string::~string((string *)&__range6);
            }
          }
          bVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_4f0);
          if (!bVar2) {
            std::__cxx11::string::operator+=((string *)local_88," (");
            __end6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_4f0);
            attribute = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_4f0);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&attribute), bVar2) {
              local_5b0 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end6);
              std::operator+(&local_5d0,local_5b0,",");
              std::__cxx11::string::operator+=((string *)local_88,(string *)&local_5d0);
              std::__cxx11::string::~string((string *)&local_5d0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end6);
            }
            std::__cxx11::string::pop_back();
            std::__cxx11::string::operator+=((string *)local_88,")");
          }
          std::__cxx11::string::operator+=((string *)local_88,";\n");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4f0);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_428);
      }
      std::__cxx11::string::operator+=((string *)local_88,"}\n\n");
      local_3dc = 0;
    }
    else {
      local_3dc = 0x13;
    }
    ProtobufToFbsIdMap::~ProtobufToFbsIdMap((ProtobufToFbsIdMap *)local_3d8);
    if ((local_3dc != 0) && (local_3dc != 0x13)) goto LAB_001b96ba;
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_388);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_88);
  local_3dc = 1;
LAB_001b96ba:
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenerateFBS(const Parser &parser,
                               const std::string &file_name,
                               bool no_log = false) {
  // Proto namespaces may clash with table names, escape the ones that were
  // generated from a table:
  for (auto it = parser.namespaces_.begin(); it != parser.namespaces_.end();
       ++it) {
    auto &ns = **it;
    for (size_t i = 0; i < ns.from_table; i++) {
      ns.components[ns.components.size() - 1 - i] += "_";
    }

    if (parser.opts.proto_mode && !parser.opts.proto_namespace_suffix.empty()) {
      // Since we know that all these namespaces come from a .proto, and all are
      // being converted, we can simply apply this suffix to all of them.
      ns.components.insert(ns.components.end() - ns.from_table,
                           parser.opts.proto_namespace_suffix);
    }
  }

  std::string schema;
  schema += "// Generated from " + file_name + ".proto\n\n";
  if (parser.opts.include_dependence_headers) {
    // clang-format off
    int num_includes = 0;
    for (auto it = parser.included_files_.begin();
         it != parser.included_files_.end(); ++it) {
      if (it->second.empty()) {
        continue;
}
      std::string basename;
      if(parser.opts.keep_prefix) {
        basename = flatbuffers::StripExtension(it->second);
      } else {
        basename = flatbuffers::StripPath(
                flatbuffers::StripExtension(it->second));
      }
      schema += "include \"" + basename + ".fbs\";\n";
      num_includes++;
    }
    if (num_includes) schema += "\n";
    // clang-format on
  }

  // Generate code for all the enum declarations.
  const Namespace *last_namespace = nullptr;
  for (auto enum_def_it = parser.enums_.vec.begin();
       enum_def_it != parser.enums_.vec.end(); ++enum_def_it) {
    EnumDef &enum_def = **enum_def_it;
    if (parser.opts.include_dependence_headers && enum_def.generated) {
      continue;
    }
    GenNameSpace(*enum_def.defined_namespace, &schema, &last_namespace);
    GenComment(enum_def.doc_comment, &schema, nullptr);
    if (enum_def.is_union) {
      schema += "union " + enum_def.name;
    } else {
      schema += "enum " + enum_def.name + " : ";
    }

    schema += GenType(enum_def.underlying_type, true) + " {\n";

    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &schema, nullptr, "  ");
      if (enum_def.is_union) {
        schema += "  " + GenType(ev.union_type) + ",\n";
      } else {
        schema += "  " + ev.name + " = " + enum_def.ToString(ev) + ",\n";
      }
    }
    schema += "}\n\n";
  }
  // Generate code for all structs/tables.
  for (auto it = parser.structs_.vec.begin(); it != parser.structs_.vec.end();
       ++it) {
    StructDef &struct_def = **it;
    const auto proto_fbs_ids = MapProtoIdsToFieldsId(
        struct_def, parser.opts.proto_id_gap_action, no_log);
    if (!proto_fbs_ids.successful) { return {}; }

    if (parser.opts.include_dependence_headers && struct_def.generated) {
      continue;
    }

    GenNameSpace(*struct_def.defined_namespace, &schema, &last_namespace);
    GenComment(struct_def.doc_comment, &schema, nullptr);
    schema += "table " + struct_def.name + " {\n";
    for (auto field_it = struct_def.fields.vec.begin();
         field_it != struct_def.fields.vec.end(); ++field_it) {
      auto &field = **field_it;
      if (field.value.type.base_type != BASE_TYPE_UTYPE) {
        GenComment(field.doc_comment, &schema, nullptr, "  ");
        schema += "  " + field.name + ":" + GenType(field.value.type);
        if (field.value.constant != "0") schema += " = " + field.value.constant;
        std::vector<std::string> attributes;
        if (field.IsRequired()) attributes.push_back("required");
        if (field.key) attributes.push_back("key");

        if (parser.opts.keep_proto_id) {
          auto it = proto_fbs_ids.field_to_id.find(field.name);
          if (it != proto_fbs_ids.field_to_id.end()) {
            attributes.push_back("id: " + NumToString(it->second));
          }  // If not found it means we do not have any ids
        }

        if (!attributes.empty()) {
          schema += " (";
          for (const auto &attribute : attributes) {
            schema += attribute + ",";
          }
          schema.pop_back();
          schema += ")";
        }

        schema += ";\n";
      }
    }
    schema += "}\n\n";
  }
  return schema;
}